

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Minefield_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_State_PDU *this)

{
  pointer pPVar1;
  pointer pEVar2;
  ostream *poVar3;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  KINT32 Value_00;
  pointer pPVar4;
  pointer pEVar5;
  KStringStream ss;
  KString local_2b8;
  KString local_298;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_298,(Header7 *)this);
  poVar3 = std::operator<<(local_1a8,(string *)&local_298);
  poVar3 = std::operator<<(poVar3,"-Minefield State PDU-\n");
  Minefield_Header::GetAsString_abi_cxx11_(&local_2b8,&this->super_Minefield_Header);
  poVar3 = std::operator<<(poVar3,(string *)&local_2b8);
  poVar3 = std::operator<<(poVar3,"Sequence Number:     ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_SeqNumUnion).m_ui16SeqNum >> 1);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Force ID:            ");
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            (&local_1d8,(ENUMS *)(ulong)this->m_ui8ForceID,Value);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Number Perim Points: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8NumPerimPoints);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Minefield Type:      ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_1f8,&this->m_MinefieldType);
  poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
  poVar3 = std::operator<<(poVar3,"Number Mine Types:   ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_ui16NumMineTypes);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Minefield Location:  ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_218,&this->m_Loc);
  poVar3 = std::operator<<(poVar3,(string *)&local_218);
  poVar3 = std::operator<<(poVar3,"Orientation:         ");
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_238,&this->m_Ori);
  poVar3 = std::operator<<(poVar3,(string *)&local_238);
  DATA_TYPE::MinefieldAppearance::GetAsString_abi_cxx11_(&local_258,&this->m_App);
  poVar3 = std::operator<<(poVar3,(string *)&local_258);
  poVar3 = std::operator<<(poVar3,"Protocol Mode:       ");
  DATA_TYPE::ENUMS::GetEnumAsStringMinefieldProtocolMode_abi_cxx11_
            (&local_278,(ENUMS *)(ulong)((this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16 & 3),
             Value_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_278);
  poVar3 = std::operator<<(poVar3,"\n");
  std::operator<<(poVar3,"Perimeter Points:\n");
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  pPVar1 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar4 = (this->m_vPoints).
                super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar4 != pPVar1; pPVar4 = pPVar4 + 1) {
    (*(pPVar4->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2b8,pPVar4);
    UTILS::IndentString(&local_298,&local_2b8,Tabs,in_CL);
    std::operator<<(local_1a8,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  std::operator<<(local_1a8,"Mine Types:\n");
  pEVar2 = (this->m_vMineTypes).
           super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar5 = (this->m_vMineTypes).
                super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar2; pEVar5 = pEVar5 + 1) {
    (*(pEVar5->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2b8,pEVar5);
    UTILS::IndentString(&local_298,&local_2b8,Tabs_00,in_CL);
    std::operator<<(local_1a8,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString Minefield_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Minefield State PDU-\n"
       << Minefield_Header::GetAsString()
       << "Sequence Number:     " << m_SeqNumUnion.m_ui16SeqNum15           << "\n"
       << "Force ID:            " << GetEnumAsStringForceID( m_ui8ForceID ) << "\n"
       << "Number Perim Points: " << ( KUINT16 )m_ui8NumPerimPoints         << "\n"
       << "Minefield Type:      " << m_MinefieldType.GetAsString()
       << "Number Mine Types:   " << m_ui16NumMineTypes                     << "\n"
       << "Minefield Location:  " << m_Loc.GetAsString()
       << "Orientation:         " << m_Ori.GetAsString()
       << m_App.GetAsString()
       << "Protocol Mode:       " << GetEnumAsStringMinefieldProtocolMode( m_ui16ProtocolModeUnion.m_ui16ProtocolMode2 ) << "\n"
       << "Perimeter Points:\n";

    std::vector<PerimeterPointCoordinate>::const_iterator citrPnt = m_vPoints.begin();
    std::vector<PerimeterPointCoordinate>::const_iterator citrEndPnt = m_vPoints.end();
    for( ; citrPnt != citrEndPnt; ++citrPnt )
    {
        ss << IndentString( citrPnt->GetAsString(), 1 );
    }

    ss << "Mine Types:\n";

    std::vector<EntityType>::const_iterator citrTyp = m_vMineTypes.begin();
    std::vector<EntityType>::const_iterator citrEndTyp = m_vMineTypes.end();
    for( ; citrTyp != citrEndTyp; ++citrTyp )
    {
        ss << IndentString( citrTyp->GetAsString(), 1 );
    }

    return ss.str();
}